

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int JS_ToInt64Clamp(JSContext *ctx,int64_t *pres,JSValue val,int64_t min,int64_t max,
                   int64_t neg_offset)

{
  int iVar1;
  long lVar2;
  
  if (0xfffffff4 < (uint)val.tag) {
    *(int *)val.u.ptr = *val.u.ptr + 1;
  }
  iVar1 = JS_ToInt64SatFree(ctx,pres,val);
  if (iVar1 == 0) {
    lVar2 = *pres;
    if (lVar2 < 0) {
      lVar2 = lVar2 + neg_offset;
      *pres = lVar2;
    }
    if ((lVar2 < min) || (min = max, max < lVar2)) {
      *pres = min;
    }
  }
  return iVar1;
}

Assistant:

int JS_ToInt64Clamp(JSContext *ctx, int64_t *pres, JSValueConst val,
                    int64_t min, int64_t max, int64_t neg_offset)
{
    int res = JS_ToInt64SatFree(ctx, pres, JS_DupValue(ctx, val));
    if (res == 0) {
        if (*pres < 0)
            *pres += neg_offset;
        if (*pres < min)
            *pres = min;
        else if (*pres > max)
            *pres = max;
    }
    return res;
}